

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderRenderCase.cpp
# Opt level: O2

int __thiscall deqp::ShaderRenderCase::init(ShaderRenderCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *log;
  RenderContext *renderCtx;
  int iVar1;
  deUint32 dVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  TestError *this_01;
  allocator<char> local_13a;
  allocator<char> local_139;
  string local_138;
  string local_118;
  ProgramSources local_f8;
  
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(dVar2,"ShaderRenderCase::init() begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
                  ,0x1b1);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,(this->m_vertShaderSource)._M_dataplus._M_p,&local_139);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,(this->m_fragShaderSource)._M_dataplus._M_p,&local_13a);
  glu::makeVtxFragSources(&local_f8,&local_118,&local_138);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_f8);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_f8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  glu::operator<<(log,this->m_program);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    dVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    glu::checkError(dVar2,"ShaderRenderCase::init() end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
                    ,0x1be);
    return extraout_EAX;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Failed to compile shader program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderRenderCase.cpp"
             ,0x1bc);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderRenderCase::init(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_renderCtx.getFunctions();

	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderRenderCase::init() begin");

	DE_ASSERT(!m_program);
	m_program =
		new ShaderProgram(m_renderCtx, glu::makeVtxFragSources(m_vertShaderSource.c_str(), m_fragShaderSource.c_str()));

	try
	{
		log << *m_program; // Always log shader program.

		if (!m_program->isOk())
			TCU_FAIL("Failed to compile shader program");

		GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderRenderCase::init() end");
	}
	catch (const std::exception&)
	{
		// Clean up.
		ShaderRenderCase::deinit();
		throw;
	}
}